

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.h
# Opt level: O3

void __thiscall
mocker::detail::RegisterAllocator::RegisterAllocator
          (RegisterAllocator *this,Section *section,LineIter funcBeg,LineIter funcEnd)

{
  this->section = section;
  (this->funcBeg)._M_node = funcBeg._M_node;
  (this->funcEnd)._M_node = funcEnd._M_node;
  *(undefined8 *)&(this->interG).enableMoves.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->interG).enableMoves.super__Function_base._M_functor + 8) = 0;
  (this->interG).enableMoves.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->interG).enableMoves._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->interG).isMoveRelated.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->interG).isMoveRelated.super__Function_base._M_functor + 8) = 0;
  (this->interG).isMoveRelated.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->interG).isMoveRelated._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->interG).freezeMoves.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->interG).freezeMoves.super__Function_base._M_functor + 8) = 0;
  (this->interG).freezeMoves.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->interG).freezeMoves._M_invoker = (_Invoker_type)0x0;
  (this->interG).edges._M_h._M_buckets = &(this->interG).edges._M_h._M_single_bucket;
  (this->interG).edges._M_h._M_bucket_count = 1;
  (this->interG).edges._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->interG).edges._M_h._M_element_count = 0;
  (this->interG).edges._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interG).edges._M_h._M_rehash_policy._M_next_resize = 0;
  (this->interG).edges._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->interG).originalAdjList._M_h._M_buckets =
       &(this->interG).originalAdjList._M_h._M_single_bucket;
  (this->interG).originalAdjList._M_h._M_bucket_count = 1;
  (this->interG).originalAdjList._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->interG).originalAdjList._M_h._M_element_count = 0;
  (this->interG).originalAdjList._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interG).originalAdjList._M_h._M_rehash_policy._M_next_resize = 0;
  (this->interG).originalAdjList._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->interG).curDegree._M_h._M_buckets = &(this->interG).curDegree._M_h._M_single_bucket;
  (this->interG).curDegree._M_h._M_bucket_count = 1;
  (this->interG).curDegree._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->interG).curDegree._M_h._M_element_count = 0;
  (this->interG).curDegree._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interG).curDegree._M_h._M_rehash_policy._M_next_resize = 0;
  (this->interG).curDegree._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->interG).simplifiable._M_h._M_buckets = &(this->interG).simplifiable._M_h._M_single_bucket;
  (this->interG).simplifiable._M_h._M_bucket_count = 1;
  (this->interG).simplifiable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->interG).simplifiable._M_h._M_element_count = 0;
  (this->interG).simplifiable._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interG).simplifiable._M_h._M_rehash_policy._M_next_resize = 0;
  (this->interG).simplifiable._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->interG).highDegree._M_h._M_buckets = &(this->interG).highDegree._M_h._M_single_bucket;
  (this->interG).highDegree._M_h._M_bucket_count = 1;
  (this->interG).highDegree._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->interG).highDegree._M_h._M_element_count = 0;
  (this->interG).highDegree._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interG).highDegree._M_h._M_rehash_policy._M_next_resize = 0;
  (this->interG).highDegree._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->interG).freeze._M_h._M_buckets = &(this->interG).freeze._M_h._M_single_bucket;
  (this->interG).freeze._M_h._M_bucket_count = 1;
  (this->interG).freeze._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->interG).freeze._M_h._M_element_count = 0;
  (this->interG).freeze._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interG).freeze._M_h._M_rehash_policy._M_next_resize = 0;
  (this->interG).freeze._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->interG).coalesced._M_h._M_buckets = &(this->interG).coalesced._M_h._M_single_bucket;
  (this->interG).coalesced._M_h._M_bucket_count = 1;
  (this->interG).coalesced._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->interG).coalesced._M_h._M_element_count = 0;
  (this->interG).coalesced._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interG).coalesced._M_h._M_rehash_policy._M_next_resize = 0;
  (this->interG).coalesced._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->interG).removed._M_h._M_buckets = &(this->interG).removed._M_h._M_single_bucket;
  (this->interG).removed._M_h._M_bucket_count = 1;
  (this->interG).removed._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->interG).removed._M_h._M_element_count = 0;
  (this->interG).removed._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interG).removed._M_h._M_rehash_policy._M_next_resize = 0;
  (this->interG).removed._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->interG).alias._M_h._M_buckets = &(this->interG).alias._M_h._M_single_bucket;
  (this->interG).alias._M_h._M_bucket_count = 1;
  (this->interG).alias._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->interG).alias._M_h._M_element_count = 0;
  (this->interG).alias._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interG).selectStack.
  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->interG).selectStack.
  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->interG).alias._M_h._M_rehash_policy._M_next_resize = 0;
  (this->interG).alias._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->interG).selectStack.
  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->moveInfo).active._M_h._M_buckets = &(this->moveInfo).active._M_h._M_single_bucket;
  (this->moveInfo).active._M_h._M_bucket_count = 1;
  (this->moveInfo).active._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->moveInfo).active._M_h._M_element_count = 0;
  (this->moveInfo).active._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->moveInfo).active._M_h._M_rehash_policy._M_next_resize = 0;
  (this->moveInfo).active._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->moveInfo).constrained._M_h._M_buckets = &(this->moveInfo).constrained._M_h._M_single_bucket
  ;
  (this->moveInfo).constrained._M_h._M_bucket_count = 1;
  (this->moveInfo).constrained._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->moveInfo).constrained._M_h._M_element_count = 0;
  (this->moveInfo).constrained._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->moveInfo).constrained._M_h._M_rehash_policy._M_next_resize = 0;
  (this->moveInfo).constrained._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->moveInfo).frozen._M_h._M_buckets = &(this->moveInfo).frozen._M_h._M_single_bucket;
  (this->moveInfo).frozen._M_h._M_bucket_count = 1;
  (this->moveInfo).frozen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->moveInfo).frozen._M_h._M_element_count = 0;
  (this->moveInfo).frozen._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->moveInfo).frozen._M_h._M_rehash_policy._M_next_resize = 0;
  (this->moveInfo).frozen._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->moveInfo).coalesced._M_h._M_buckets = &(this->moveInfo).coalesced._M_h._M_single_bucket;
  (this->moveInfo).coalesced._M_h._M_bucket_count = 1;
  (this->moveInfo).coalesced._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->moveInfo).coalesced._M_h._M_element_count = 0;
  (this->moveInfo).coalesced._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->moveInfo).coalesced._M_h._M_rehash_policy._M_next_resize = 0;
  (this->moveInfo).coalesced._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->moveInfo).worklist._M_h._M_buckets = &(this->moveInfo).worklist._M_h._M_single_bucket;
  (this->moveInfo).worklist._M_h._M_bucket_count = 1;
  (this->moveInfo).worklist._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->moveInfo).worklist._M_h._M_element_count = 0;
  (this->moveInfo).worklist._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->moveInfo).worklist._M_h._M_rehash_policy._M_next_resize = 0;
  (this->moveInfo).worklist._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->moveInfo).associatedMoves._M_h._M_buckets =
       &(this->moveInfo).associatedMoves._M_h._M_single_bucket;
  (this->moveInfo).associatedMoves._M_h._M_bucket_count = 1;
  (this->moveInfo).associatedMoves._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->moveInfo).associatedMoves._M_h._M_element_count = 0;
  (this->moveInfo).associatedMoves._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->moveInfo).associatedMoves._M_h._M_rehash_policy._M_next_resize = 0;
  (this->moveInfo).associatedMoves._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->spilledLastTime)._M_h._M_buckets = &(this->spilledLastTime)._M_h._M_single_bucket;
  (this->spilledLastTime)._M_h._M_bucket_count = 1;
  (this->spilledLastTime)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->spilledLastTime)._M_h._M_element_count = 0;
  (this->spilledLastTime)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->spilledLastTime)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->spilledLastTime)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

RegisterAllocator(nasm::Section &section, LineIter funcBeg, LineIter funcEnd)
      : section(section), funcBeg(funcBeg), funcEnd(funcEnd) {}